

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int __how;
  msg_finish *pmVar2;
  acto *paVar3;
  long lVar4;
  msg_finish local_41;
  actor_ref wall;
  actor_ref console;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Balls    : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Duration : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2000);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Players  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10000);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (lVar4 = 1; lVar4 != 4; lVar4 = lVar4 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"--- ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," : start acto ---");
    std::endl<char,std::char_traits<char>>(poVar1);
    acto::spawn<Console>((acto *)&console,bind);
    acto::spawn<Wall>();
    acto::actor_ref::send<msg_out,char_const(&)[11]>(&console,(char (*) [11])"send start");
    acto::actor_ref::send<msg_start,int_const&,acto::actor_ref&>(&wall,&BALLS,&console);
    acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
              ((duration<long,_std::ratio<1L,_1000L>_>)0x103598);
    pmVar2 = &local_41;
    acto::actor_ref::send<msg_finish>(&wall,&local_41);
    __how = (int)pmVar2;
    acto::join(&wall);
    acto::this_thread::process_messages();
    acto::actor_ref::~actor_ref(&wall);
    acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
              ((duration<long,_std::ratio<1L,_1000L>_>)0x1035c2);
    paVar3 = (acto *)&console;
    acto::actor_ref::~actor_ref(&console);
    acto::shutdown((int)paVar3,__how);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- end acto ---");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,": end");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
  std::cout << "Balls    : " << BALLS    << std::endl;
  std::cout << "Duration : " << DURATION << std::endl;
  std::cout << "Players  : " << PLAYERS  << std::endl;
  std::cout << std::endl;

  for (unsigned int i = 1; i < 4; i++) {
    std::cout << "--- " << i << " : start acto ---" << std::endl;
    {
      // Создать консоль.
      // Все актеры должны создаваться с использованием шаблона act_o::spawn<>.
      // Использование оператора new недопустимо.
      acto::actor_ref console = acto::spawn< Console >(acto::actor_thread::bind);

      for(unsigned int j = 0; j < 1; j++) {
        // Создать стену.
        // Опция "acto::aoExclusive" создает для объекта отдельный поток,
        // в котором будут выполнятся все обработчики этого объекта
        acto::actor_ref wall = acto::spawn< Wall >();

        // -
        console.send< msg_out >("send start");

        // Начать игру: инициализировать объект, запустить мячи
        wall.send< msg_start >(BALLS, console);

        // Игра продолжается некоторое время в независимых потоках
        acto::this_thread::sleep_for(std::chrono::milliseconds(DURATION));

        // Остановить игру
        wall.send(msg_finish());

        // Дождаться завершения выполнения
        acto::join(wall);

        // Обработать сообщения для консоли
        acto::this_thread::process_messages();
      }
      acto::this_thread::sleep_for(std::chrono::milliseconds(1000));
    }
    // По зовершении работы библиотеки необходимо вызвать эту функцию,
    // чтобы освободить все занимаемые ресурсы.
    acto::shutdown();
    // -
    std::cout << "--- end acto ---" << std::endl;
  }

  // Выполнение программы закончено
  std::cout << ": end" << std::endl;
#ifdef ACTO_WIN
  _getch();
#endif
  // -
  return 0;
}